

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

SPIRType * __thiscall
spirv_cross::CompilerMSL::get_presumed_input_type
          (SPIRType *__return_storage_ptr__,CompilerMSL *this,SPIRType *ib_type,uint32_t index)

{
  bool bVar1;
  bool bVar2;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t uVar3;
  SPIRType *pSVar4;
  pointer ppVar5;
  _Self local_60;
  key_type local_58;
  _Self local_50;
  const_iterator p_va;
  uint32_t cmp;
  uint32_t loc;
  uint32_t index_local;
  SPIRType *ib_type_local;
  CompilerMSL *this_local;
  SPIRType *type;
  
  pSVar4 = get_physical_member_type(this,ib_type,index);
  SPIRType::SPIRType(__return_storage_ptr__,pSVar4);
  id = TypedID::operator_cast_to_TypedID((TypedID *)&(ib_type->super_IVariant).self);
  uVar3 = Compiler::get_member_decoration((Compiler *)this,id.id,index,DecorationLocation);
  p_va._M_node._4_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&(ib_type->super_IVariant).self)
  ;
  local_58.component =
       Compiler::get_member_decoration
                 ((Compiler *)this,p_va._M_node._4_4_,index,DecorationComponent);
  local_58.location = uVar3;
  local_50._M_node =
       (_Base_ptr)
       ::std::
       map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
       ::find(&this->inputs_by_location,&local_58);
  local_60._M_node =
       (_Base_ptr)
       ::std::
       end<std::map<spirv_cross::LocationComponentPair,spirv_cross::MSLShaderInterfaceVariable,std::less<spirv_cross::LocationComponentPair>,std::allocator<std::pair<spirv_cross::LocationComponentPair_const,spirv_cross::MSLShaderInterfaceVariable>>>>
                 (&this->inputs_by_location);
  bVar2 = ::std::operator!=(&local_50,&local_60);
  bVar1 = false;
  if (bVar2) {
    ppVar5 = ::std::
             _Rb_tree_const_iterator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>
             ::operator->(&local_50);
    bVar1 = __return_storage_ptr__->vecsize < (ppVar5->second).vecsize;
  }
  if (bVar1) {
    ppVar5 = ::std::
             _Rb_tree_const_iterator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>
             ::operator->(&local_50);
    __return_storage_ptr__->vecsize = (ppVar5->second).vecsize;
  }
  return __return_storage_ptr__;
}

Assistant:

SPIRType CompilerMSL::get_presumed_input_type(const SPIRType &ib_type, uint32_t index) const
{
	SPIRType type = get_physical_member_type(ib_type, index);
	uint32_t loc = get_member_decoration(ib_type.self, index, DecorationLocation);
	uint32_t cmp = get_member_decoration(ib_type.self, index, DecorationComponent);
	auto p_va = inputs_by_location.find({loc, cmp});
	if (p_va != end(inputs_by_location) && p_va->second.vecsize > type.vecsize)
		type.vecsize = p_va->second.vecsize;

	return type;
}